

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setRandomUniforms
          (Program *this,vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *uniforms,
          string *shaderNameManglingSuffix,Random *rnd)

{
  bool bVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  size_type sVar5;
  GLchar *name;
  float fVar6;
  int local_11c;
  GLuint local_118;
  int i_3;
  deUint32 val_3 [4];
  int local_fc;
  GLint local_f8;
  int i_2;
  int val_2 [4];
  int local_dc;
  GLfloat local_d8;
  int i_1;
  float val_1 [16];
  int local_8c;
  GLfloat local_88;
  int i;
  float val [4];
  string local_60;
  GLint local_40;
  int local_3c;
  int location;
  int typeScalarSize;
  VarSpec *spec;
  Random *pRStack_28;
  int unifNdx;
  Random *rnd_local;
  string *shaderNameManglingSuffix_local;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *uniforms_local;
  Program *this_local;
  
  pRStack_28 = rnd;
  rnd_local = (Random *)shaderNameManglingSuffix;
  shaderNameManglingSuffix_local = (string *)uniforms;
  uniforms_local = (vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *)this;
  use(this);
  for (spec._4_4_ = 0; iVar3 = spec._4_4_,
      sVar5 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                        ((vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *)
                         shaderNameManglingSuffix_local), iVar3 < (int)sVar5;
      spec._4_4_ = spec._4_4_ + 1) {
    _location = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::operator[]
                          ((vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *)
                           shaderNameManglingSuffix_local,(long)spec._4_4_);
    local_3c = glu::getDataTypeScalarSize(_location->type);
    GVar4 = this->m_programGL;
    mangleShaderNames(&local_60,&_location->name,(string *)rnd_local);
    name = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = glwGetUniformLocation(GVar4,name);
    std::__cxx11::string::~string((string *)&local_60);
    local_40 = GVar2;
    if (-1 < GVar2) {
      bVar1 = glu::isDataTypeFloatOrVec(_location->type);
      if (bVar1) {
        for (local_8c = 0; local_8c < local_3c; local_8c = local_8c + 1) {
          fVar6 = de::Random::getFloat
                            (pRStack_28,*(float *)((long)&_location->minValue + (long)local_8c * 4),
                             *(float *)((long)&_location->maxValue + (long)local_8c * 4));
          (&local_88)[local_8c] = fVar6;
        }
        switch(_location->type) {
        case TYPE_FLOAT:
          glwUniform1f(local_40,local_88);
          break;
        case TYPE_FLOAT_VEC2:
          glwUniform2f(local_40,local_88,(GLfloat)i);
          break;
        case TYPE_FLOAT_VEC3:
          glwUniform3f(local_40,local_88,(GLfloat)i,val[0]);
          break;
        case TYPE_FLOAT_VEC4:
          glwUniform4f(local_40,local_88,(GLfloat)i,val[0],val[1]);
        }
      }
      else {
        bVar1 = glu::isDataTypeMatrix(_location->type);
        if (bVar1) {
          for (local_dc = 0; local_dc < local_3c; local_dc = local_dc + 1) {
            fVar6 = de::Random::getFloat
                              (pRStack_28,
                               *(float *)((long)&_location->minValue + (long)local_dc * 4),
                               *(float *)((long)&_location->maxValue + (long)local_dc * 4));
            (&local_d8)[local_dc] = fVar6;
          }
          switch(_location->type) {
          case TYPE_FLOAT_MAT2:
            glwUniformMatrix2fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT2X3:
            glwUniformMatrix2x3fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT2X4:
            glwUniformMatrix2x4fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT3X2:
            glwUniformMatrix3x2fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT3:
            glwUniformMatrix3fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT3X4:
            glwUniformMatrix3x4fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT4X2:
            glwUniformMatrix4x2fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT4X3:
            glwUniformMatrix4x3fv(local_40,1,'\0',&local_d8);
            break;
          case TYPE_FLOAT_MAT4:
            glwUniformMatrix4fv(local_40,1,'\0',&local_d8);
          }
        }
        else {
          bVar1 = glu::isDataTypeIntOrIVec(_location->type);
          if (bVar1) {
            for (local_fc = 0; local_fc < local_3c; local_fc = local_fc + 1) {
              iVar3 = de::Random::getInt(pRStack_28,
                                         *(int *)((long)&_location->minValue + (long)local_fc * 4),
                                         *(int *)((long)&_location->maxValue + (long)local_fc * 4));
              (&local_f8)[local_fc] = iVar3;
            }
            switch(_location->type) {
            case TYPE_INT:
              glwUniform1i(local_40,local_f8);
              break;
            case TYPE_INT_VEC2:
              glwUniform2i(local_40,local_f8,i_2);
              break;
            case TYPE_INT_VEC3:
              glwUniform3i(local_40,local_f8,i_2,val_2[0]);
              break;
            case TYPE_INT_VEC4:
              glwUniform4i(local_40,local_f8,i_2,val_2[0],val_2[1]);
            }
          }
          else {
            bVar1 = glu::isDataTypeUintOrUVec(_location->type);
            if (bVar1) {
              for (local_11c = 0; local_11c < local_3c; local_11c = local_11c + 1) {
                GVar4 = de::Random::getInt(pRStack_28,
                                           *(int *)((long)&_location->minValue + (long)local_11c * 4
                                                   ),
                                           *(int *)((long)&_location->maxValue + (long)local_11c * 4
                                                   ));
                (&local_118)[local_11c] = GVar4;
              }
              switch(_location->type) {
              case TYPE_UINT:
                glwUniform1ui(local_40,local_118);
                break;
              case TYPE_UINT_VEC2:
                glwUniform2ui(local_40,local_118,i_3);
                break;
              case TYPE_UINT_VEC3:
                glwUniform3ui(local_40,local_118,i_3,val_3[0]);
                break;
              case TYPE_UINT_VEC4:
                glwUniform4ui(local_40,local_118,i_3,val_3[0],val_3[1]);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Program::setRandomUniforms (const vector<VarSpec>& uniforms, const string& shaderNameManglingSuffix, Random& rnd) const
{
	use();

	for (int unifNdx = 0; unifNdx < (int)uniforms.size(); unifNdx++)
	{
		const VarSpec&	spec			= uniforms[unifNdx];
		const int		typeScalarSize	= glu::getDataTypeScalarSize(spec.type);
		const int		location		= glGetUniformLocation(m_programGL, mangleShaderNames(spec.name, shaderNameManglingSuffix).c_str());
		if (location < 0)
			continue;

		if (glu::isDataTypeFloatOrVec(spec.type))
		{
			float val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT:		glUniform1f(location, val[0]);							break;
				case glu::TYPE_FLOAT_VEC2:	glUniform2f(location, val[0], val[1]);					break;
				case glu::TYPE_FLOAT_VEC3:	glUniform3f(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_FLOAT_VEC4:	glUniform4f(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeMatrix(spec.type))
		{
			float val[4*4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT_MAT2:		glUniformMatrix2fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3:		glUniformMatrix3fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4:		glUniformMatrix4fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X3:	glUniformMatrix2x3fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X4:	glUniformMatrix2x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X2:	glUniformMatrix3x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X4:	glUniformMatrix3x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X2:	glUniformMatrix4x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X3:	glUniformMatrix4x3fv	(location, 1, GL_FALSE, &val[0]); break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(spec.type))
		{
			int val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);

			switch (spec.type)
			{
				case glu::TYPE_INT:			glUniform1i(location, val[0]);							break;
				case glu::TYPE_INT_VEC2:	glUniform2i(location, val[0], val[1]);					break;
				case glu::TYPE_INT_VEC3:	glUniform3i(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_INT_VEC4:	glUniform4i(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeUintOrUVec(spec.type))
		{
			deUint32 val[4];
			for (int i = 0; i < typeScalarSize; i++)
			{
				DE_ASSERT(spec.minValue.i[i] >= 0 && spec.maxValue.i[i] >= 0);
				val[i] = (deUint32)rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);
			}

			switch (spec.type)
			{
				case glu::TYPE_UINT:		glUniform1ui(location, val[0]);							break;
				case glu::TYPE_UINT_VEC2:	glUniform2ui(location, val[0], val[1]);					break;
				case glu::TYPE_UINT_VEC3:	glUniform3ui(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_UINT_VEC4:	glUniform4ui(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else
			DE_ASSERT(false);
	}
}